

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# road_network.cpp
# Opt level: O0

vector<node_type,_std::allocator<node_type>_> * __thiscall
road_network::get_predecessors
          (vector<node_type,_std::allocator<node_type>_> *__return_storage_ptr__,road_network *this,
          node_type node)

{
  type_conflict2 tVar1;
  adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
  *g_;
  pair<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>_>
  *r;
  value_type local_d9;
  reference local_d8;
  reference vd;
  adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>
  __end1;
  adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>
  __begin1;
  iterator_range_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
  local_70;
  iterator_range_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
  *local_40;
  iterator_range<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>_>
  *__range1;
  boost *local_28;
  vertex_descriptor start;
  road_network *prStack_18;
  node_type node_local;
  road_network *this_local;
  vector<node_type,_std::allocator<node_type>_> *pre;
  
  start._6_1_ = 0;
  g_ = (adj_list_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
        *)__return_storage_ptr__;
  start._7_1_ = node;
  prStack_18 = this;
  this_local = (road_network *)__return_storage_ptr__;
  std::vector<node_type,_std::allocator<node_type>_>::vector(__return_storage_ptr__);
  local_28 = (boost *)boost::
                      vertex<boost::adjacency_list<boost::listS,boost::vecS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>,boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>::config>>
                                ((ulong)start._7_1_,
                                 (vec_adj_list_impl<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config,_boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_boost::vecS,_boost::listS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>::config>_>
                                  *)this);
  boost::
  adjacent_vertices<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>::config,boost::directed_graph_helper<boost::detail::adj_list_gen<boost::adjacency_list<boost::listS,boost::vecS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>,boost::vecS,boost::listS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>::config>>
            ((pair<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>_>
              *)&__begin1.m_g,local_28,(vertex_descriptor)this,g_);
  boost::
  make_iterator_range<std::pair<boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::vecS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>,unsigned_long,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,long>,boost::adjacency_iterator<boost::adjacency_list<boost::listS,boost::vecS,boost::directedS,node_type,boost::no_property,boost::no_property,boost::listS>,unsigned_long,boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,boost::no_property>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,long>>>
            ((iterator_range<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>_>
              *)&local_70,(boost *)&__begin1.m_g,r);
  local_40 = &local_70;
  boost::iterator_range_detail::
  iterator_range_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
  ::begin((adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>
           *)&__end1.m_g,local_40);
  boost::iterator_range_detail::
  iterator_range_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_boost::iterators::incrementable_traversal_tag>
  ::end((adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>
         *)&vd,local_40);
  while (tVar1 = boost::iterators::operator!=
                           ((iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long>
                             *)&__end1.m_g,
                            (iterator_facade<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long>
                             *)&vd), tVar1) {
    local_d8 = boost::iterators::detail::
               iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long,_false,_false>
               ::operator*((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long,_false,_false>
                            *)&__end1.m_g);
    local_d9 = (value_type)local_d8;
    std::vector<node_type,_std::allocator<node_type>_>::push_back(__return_storage_ptr__,&local_d9);
    boost::iterators::detail::
    iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long,_false,_false>
    ::operator++((iterator_facade_base<boost::adjacency_iterator<boost::adjacency_list<boost::listS,_boost::vecS,_boost::directedS,_node_type,_boost::no_property,_boost::no_property,_boost::listS>,_unsigned_long,_boost::detail::out_edge_iter<std::_List_iterator<boost::detail::stored_edge_property<unsigned_long,_boost::no_property>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_long>,_unsigned_long,_boost::iterators::detail::iterator_category_with_traversal<std::input_iterator_tag,_boost::iterators::bidirectional_traversal_tag>,_unsigned_long,_long,_false,_false>
                  *)&__end1.m_g);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<node_type> road_network::get_predecessors(node_type node)
{
    std::vector<node_type> pre;
    graph::vertex_descriptor start = boost::vertex(node, _g);

    for (auto vd : boost::make_iterator_range(boost::adjacent_vertices(start, _g))) 
    {
        pre.push_back(static_cast<node_type>(vd));
    }
    return pre;
}